

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O1

Expression * __thiscall rsg::SwizzleOp::createNextChild(SwizzleOp *this,GeneratorState *state)

{
  pointer *ppiVar1;
  byte bVar2;
  pointer pSVar3;
  iterator __position;
  ValueRangeAccess dst;
  ConstValueRangeAccess valueRange;
  ConstValueRangeAccess CVar4;
  ValueRangeAccess valueRange_00;
  long lVar5;
  GeneratorState *state_00;
  pointer pSVar6;
  pointer pSVar7;
  VariableType *pVVar8;
  deUint8 *pdVar9;
  ExpressionSpec *pEVar10;
  Expression *pEVar11;
  pointer pSVar12;
  long lVar13;
  pointer pSVar14;
  pointer pSVar15;
  pointer pSVar16;
  pointer pSVar17;
  ValueRange inValueRange;
  VariableType inVarType;
  ConstValueRangeAccess local_190;
  long local_178;
  long local_170;
  GeneratorState *local_168;
  VariableType *local_160;
  SwizzleOp *local_158;
  undefined8 in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  Scalar *in_stack_fffffffffffffec0;
  ValueRange local_118;
  ConstValueRangeAccess local_98;
  VariableType local_80;
  
  if (this->m_child == (Expression *)0x0) {
    local_80.m_baseType = (this->m_outValueRange).m_type.m_baseType;
    local_80.m_numElements = this->m_numInputElements;
    local_80.m_typeName._M_dataplus._M_p = (pointer)&local_80.m_typeName.field_2;
    local_80.m_precision = PRECISION_NONE;
    local_80.m_typeName._M_string_length = 0;
    local_80.m_typeName.field_2._M_local_buf[0] = '\0';
    local_80.m_elementType = (VariableType *)0x0;
    local_80.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_80.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_80.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ValueRange::ValueRange(&local_118,&local_80);
    valueRange_00.super_ConstValueRangeAccess.m_min = (Scalar *)in_stack_fffffffffffffeb8;
    valueRange_00.super_ConstValueRangeAccess.m_type = (VariableType *)in_stack_fffffffffffffeb0;
    valueRange_00.super_ConstValueRangeAccess.m_max = in_stack_fffffffffffffec0;
    local_168 = state;
    anon_unknown_0::setInfiniteRange(valueRange_00);
    local_178 = (long)(this->m_outValueRange).m_type.m_numElements;
    if (0 < local_178) {
      local_160 = &(this->m_outValueRange).m_type;
      pdVar9 = this->m_swizzle;
      local_178 = local_178 << 2;
      local_170 = 0;
      local_158 = this;
      do {
        pSVar6 = local_118.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pSVar15 = local_118.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pSVar17 = local_118.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        pSVar12 = local_118.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        bVar2 = *pdVar9;
        pVVar8 = VariableType::getElementType(&local_118.m_type);
        pSVar7 = local_118.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pSVar16 = local_118.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pSVar3 = local_118.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pSVar14 = local_118.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (pSVar15 == pSVar6) {
          pSVar15 = (Scalar *)0x0;
        }
        if (pSVar12 == pSVar17) {
          pSVar12 = (Scalar *)0x0;
        }
        lVar13 = (long)pSVar12 + (ulong)((uint)bVar2 * 4);
        local_190.m_type = VariableType::getElementType(&local_118.m_type);
        this = local_158;
        if (pSVar16 == pSVar7) {
          pSVar16 = (Scalar *)0x0;
        }
        if (pSVar14 == pSVar3) {
          pSVar14 = (Scalar *)0x0;
        }
        local_190.m_min = pSVar14 + bVar2;
        local_190.m_max = pSVar16 + bVar2;
        pSVar12 = (local_158->m_outValueRange).m_min.
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pSVar14 = (local_158->m_outValueRange).m_min.
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pSVar17 = (local_158->m_outValueRange).m_max.
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pSVar3 = (local_158->m_outValueRange).m_max.
                 super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        local_98.m_type = VariableType::getElementType(local_160);
        lVar5 = local_170;
        if (pSVar17 == pSVar3) {
          pSVar17 = (pointer)0x0;
        }
        if (pSVar12 == pSVar14) {
          pSVar12 = (pointer)0x0;
        }
        local_98.m_min = (Scalar *)((long)pSVar12 + local_170);
        local_98.m_max = (Scalar *)((long)pSVar17 + local_170);
        dst.super_ConstValueRangeAccess.m_min = (Scalar *)lVar13;
        dst.super_ConstValueRangeAccess.m_type = pVVar8;
        dst.super_ConstValueRangeAccess.m_max = (Scalar *)((long)pSVar15 + (ulong)((uint)bVar2 * 4))
        ;
        ValueRange::computeIntersection(dst,&local_190,&local_98);
        pdVar9 = pdVar9 + 1;
        local_170 = lVar5 + 4;
      } while (local_178 != local_170);
    }
    state_00 = local_168;
    local_190.m_type = (VariableType *)CONCAT44(local_190.m_type._4_4_,2);
    __position._M_current =
         (local_168->m_precedenceStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (local_168->m_precedenceStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&local_168->m_precedenceStack,__position,
                 (int *)&local_190);
    }
    else {
      *__position._M_current = 2;
      (local_168->m_precedenceStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    local_190.m_type = &local_118.m_type;
    local_190.m_min =
         local_118.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
         super__Vector_impl_data._M_start;
    if (local_118.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_118.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_190.m_min = (Scalar *)0x0;
    }
    local_190.m_max =
         local_118.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
         super__Vector_impl_data._M_start;
    if (local_118.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_118.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_190.m_max = (Scalar *)0x0;
    }
    valueRange.m_min = local_190.m_min;
    valueRange.m_type = local_190.m_type;
    valueRange.m_max = local_190.m_max;
    pEVar10 = anon_unknown_0::chooseExpression
                        (state_00,(ExpressionSpec *)(anonymous_namespace)::s_expressionSpecs,0x1e,
                         valueRange);
    CVar4.m_min = local_190.m_min;
    CVar4.m_type = local_190.m_type;
    CVar4.m_max = local_190.m_max;
    pEVar11 = (*pEVar10->create)(state_00,CVar4);
    this->m_child = pEVar11;
    ppiVar1 = &(state_00->m_precedenceStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppiVar1 = *ppiVar1 + -1;
    ValueRange::~ValueRange(&local_118);
    VariableType::~VariableType(&local_80);
  }
  else {
    pEVar11 = (Expression *)0x0;
  }
  return pEVar11;
}

Assistant:

Expression* SwizzleOp::createNextChild (GeneratorState& state)
{
	if (m_child)
		return DE_NULL;

	// Compute input value range.
	VariableType	inVarType		= VariableType(m_outValueRange.getType().getBaseType(), m_numInputElements);
	ValueRange		inValueRange	= ValueRange(inVarType);

	// Initialize all inputs to -inf..inf
	setInfiniteRange(inValueRange);

	// Compute intersections.
	int numOutputElements = m_outValueRange.getType().getNumElements();
	for (int outElemNdx = 0; outElemNdx < numOutputElements; outElemNdx++)
	{
		int inElemNdx = m_swizzle[outElemNdx];
		ValueRange::computeIntersection(inValueRange.asAccess().component(inElemNdx), inValueRange.asAccess().component(inElemNdx), m_outValueRange.asAccess().component(outElemNdx));
	}

	// Create child.
	state.pushPrecedence(swizzlePrecedence);
	m_child = Expression::createRandom(state, inValueRange.asAccess());
	state.popPrecedence();

	return m_child;
}